

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O3

int is_valid_character(nh_roles_info *ri,int rolenum,int racenum,int gendnum,int alignnum)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if (ri->num_roles < 1) {
    uVar4 = 0;
  }
  else {
    iVar7 = 0;
    iVar8 = 0;
    do {
      if (rolenum < 0 || iVar8 == rolenum) {
        iVar1 = ri->num_races;
        if (0 < iVar1) {
          iVar5 = iVar1 * iVar8;
          iVar11 = 0;
          do {
            if ((racenum < 0 || iVar11 == racenum) && (iVar2 = ri->num_genders, 0 < iVar2)) {
              iVar9 = iVar2 * iVar5;
              iVar10 = 0;
              do {
                if (gendnum < 0 || iVar10 == gendnum) {
                  iVar3 = ri->num_aligns;
                  if (0 < (long)iVar3) {
                    uVar6 = 0;
                    do {
                      if (alignnum < 0 || (uint)alignnum == uVar6) {
                        iVar7 = (iVar7 + 1) -
                                (uint)(ri->matrix[uVar6 + (uint)(iVar3 * iVar9)] == '\0');
                      }
                      uVar6 = uVar6 + 1;
                    } while ((long)iVar3 != uVar6);
                  }
                }
                iVar10 = iVar10 + 1;
                iVar9 = iVar9 + 1;
              } while (iVar10 != iVar2);
            }
            iVar11 = iVar11 + 1;
            iVar5 = iVar5 + 1;
          } while (iVar11 != iVar1);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != ri->num_roles);
    uVar4 = (uint)(0 < iVar7);
  }
  return uVar4;
}

Assistant:

static int is_valid_character(const struct nh_roles_info *ri, int rolenum,
			      int racenum, int gendnum, int alignnum)
{
    int i, j, k, l, ok;
    
    ok = 0;
    for (i = 0; i < ri->num_roles; i++) {
	if (rolenum > ROLE_NONE && i != rolenum)
	    continue;
	
	for (j = 0; j < ri->num_races; j++) {
	    if (racenum > ROLE_NONE && j != racenum)
		continue;
	    
	    for (k = 0; k < ri->num_genders; k++) {
		if (gendnum > ROLE_NONE && k != gendnum)
		    continue;
		
		for (l = 0; l < ri->num_aligns; l++) {
		    if (alignnum > ROLE_NONE && l != alignnum)
			continue;
		    
		    if (ri->matrix[nh_cm_idx((*ri), i, j, k, l)])
			ok++;
		}
	    }
	}
    }
    
    return ok > 0;
}